

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

int fromOffsetString(QStringView offsetString,bool *valid)

{
  storage_type_conflict sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  qsizetype qVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStringView local_70;
  bool ok;
  QStringView local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *valid = false;
  iVar6 = 0;
  if (0xfffffffffffffffa < offsetString.m_size - 7U) {
    sVar1 = *offsetString.m_data;
    if (sVar1 == L'+') {
      iVar2 = 0x3c;
    }
    else {
      iVar6 = 0;
      if (sVar1 != L'-') goto LAB_003114ca;
      iVar2 = -0x3c;
    }
    local_48.m_data = offsetString.m_data + 1;
    local_48.m_size = offsetString.m_size + -1;
    iVar6 = 0;
    local_58.m_size = QStringView::indexOf(&local_48,(QChar)0x3a,0,CaseSensitive);
    lVar7 = local_58.m_size + 1;
    if (local_58.m_size + 1 == 0) {
      lVar7 = 2;
      local_58.m_size = 2;
    }
    if (local_48.m_size <= local_58.m_size) {
      local_58.m_size = local_48.m_size;
    }
    local_58.m_data = local_48.m_data;
    ok = false;
    iVar3 = QStringView::toInt(&local_58,&ok,10);
    if (iVar3 < 0x18 && ok == true) {
      qVar5 = local_48.m_size;
      if (lVar7 < local_48.m_size) {
        qVar5 = lVar7;
      }
      local_70.m_data = local_48.m_data + qVar5;
      local_70.m_size = local_48.m_size - qVar5;
      iVar6 = 0;
      uVar4 = 0;
      if (lVar7 < local_48.m_size) {
        uVar4 = QStringView::toInt(&local_70,&ok,10);
      }
      if ((uVar4 < 0x3c) && ((ok & 1U) != 0)) {
        *valid = true;
        iVar6 = iVar2 * (uVar4 + iVar3 * 0x3c);
      }
    }
  }
LAB_003114ca:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fromOffsetString(QStringView offsetString, bool *valid) noexcept
{
    *valid = false;

    const qsizetype size = offsetString.size();
    if (size < 2 || size > 6)
        return 0;

    // sign will be +1 for a positive and -1 for a negative offset
    int sign;

    // First char must be + or -
    const QChar signChar = offsetString[0];
    if (signChar == u'+')
        sign = 1;
    else if (signChar == u'-')
        sign = -1;
    else
        return 0;

    // Split the hour and minute parts
    const QStringView time = offsetString.sliced(1);
    qsizetype hhLen = time.indexOf(u':');
    qsizetype mmIndex;
    if (hhLen == -1)
        mmIndex = hhLen = 2; // ±HHmm or ±HH format
    else
        mmIndex = hhLen + 1;

    const QStringView hhRef = time.first(qMin(hhLen, time.size()));
    bool ok = false;
    const int hour = hhRef.toInt(&ok);
    if (!ok || hour > 23) // More generous than QTimeZone::MaxUtcOffsetSecs
        return 0;

    const QStringView mmRef = time.sliced(qMin(mmIndex, time.size()));
    const int minute = mmRef.isEmpty() ? 0 : mmRef.toInt(&ok);
    if (!ok || minute < 0 || minute > 59)
        return 0;

    *valid = true;
    return sign * ((hour * 60) + minute) * 60;
}